

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_token_string(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *this)

{
  pointer pvVar1;
  size_type __maxlen;
  long in_RSI;
  string *in_RDI;
  array<char,_3UL> cr;
  allocator local_15;
  array<char,_3UL> local_14 [6];
  
  local_14[0]._M_elems[2] = '\0';
  local_14[0]._M_elems[0] = '\0';
  local_14[0]._M_elems[1] = '\0';
  pvVar1 = std::array<char,_3UL>::data((array<char,_3UL> *)0xe06160);
  __maxlen = std::array<char,_3UL>::size(local_14);
  snprintf(pvVar1,__maxlen,"%.2hhX",(ulong)*(byte *)(in_RSI + 0x10));
  pvVar1 = std::array<char,_3UL>::data((array<char,_3UL> *)0xe06198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar1,&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  return in_RDI;
}

Assistant:

std::string get_token_string() const
    {
        std::array<char, 3> cr{{}};
        static_cast<void>((std::snprintf)(cr.data(), cr.size(), "%.2hhX", static_cast<unsigned char>(current))); // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
        return std::string{cr.data()};
    }